

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

bool __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  Node *pNVar4;
  Node *n;
  vec2 *pvVar5;
  _func_int *p_Var6;
  Element *first;
  vec2 vVar7;
  uint uVar8;
  ostream *poVar9;
  long lVar10;
  float *pfVar11;
  mat4 *pmVar12;
  Element *__s;
  uint *puVar13;
  mat4 *pmVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  uint auStack_160 [20];
  undefined8 uStack_110;
  undefined1 auStack_108 [4];
  mat4 local_104;
  float local_c0 [6];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined8 local_84;
  mat4 local_78;
  
  bVar18 = 0;
  pNVar4 = (this->super_Renderer).m_sceneRoot;
  if (pNVar4 == (Node *)0x0) {
    uStack_110 = 0x1166ff;
    poVar9 = std::operator<<((ostream *)&std::cerr,"W [");
    uStack_110 = 0x11670e;
    log_timestring_abi_cxx11_();
    uStack_110 = 0x116719;
    poVar9 = std::operator<<(poVar9,(string *)&local_78);
    uStack_110 = 0x116728;
    poVar9 = std::operator<<(poVar9,"]: ");
    uStack_110 = 0x116737;
    poVar9 = std::operator<<(poVar9,"virtual bool rengine::OpenGLRenderer::render()");
    uStack_110 = 0x116746;
    poVar9 = std::operator<<(poVar9,": ");
    uStack_110 = 0x116755;
    poVar9 = std::operator<<(poVar9," - no \'sceneRoot\', surely this is not what you intended?");
    uStack_110 = 0x11675d;
    std::endl<char,std::char_traits<char>>(poVar9);
    uStack_110 = 0x116766;
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    uVar1 = (this->super_Renderer).m_fillColor.x;
    uVar3 = (this->super_Renderer).m_fillColor.y;
    uVar2._0_4_ = (this->super_Renderer).m_fillColor.z;
    uVar2._4_4_ = (this->super_Renderer).m_fillColor.w;
    uStack_110 = 0x1164e5;
    glClearColor(uVar1,uVar3,uVar2,uVar2._4_4_);
    uStack_110 = 0x1164ef;
    glClear(0x4000);
    this->m_numTransformNodesWith3d = 0;
    this->m_numRenderNodes = 0;
    this->m_additionalQuads = 0;
    this->m_vertexIndex = 0;
    this->m_numLayeredNodes = 0;
    this->m_numTextureNodes = 0;
    this->m_numRectangleNodes = 0;
    this->m_numTransformNodes = 0;
    this->m_elementIndex = 0;
    uStack_110 = 0x116513;
    prepass(this,(this->super_Renderer).m_sceneRoot);
    iVar15 = this->m_numLayeredNodes + this->m_numTextureNodes + this->m_numRectangleNodes;
    uVar8 = this->m_additionalQuads + iVar15;
    if ((uVar8 & 0x3fffffff) != 0) {
      uVar17 = (ulong)(uVar8 * 4);
      this->m_vertices = (vec2 *)(auStack_108 + uVar17 * -8);
      uVar8 = iVar15 + this->m_numTransformNodesWith3d + this->m_numRenderNodes;
      uVar16 = (ulong)uVar8;
      __s = (Element *)((vec2 *)(auStack_108 + uVar17 * -8) + uVar16 * -4);
      this->m_elements = __s;
      *(undefined8 *)&__s[-1].field_0x18 = 0x11658a;
      memset(__s,0,uVar16 * 0x20);
      n = (this->super_Renderer).m_sceneRoot;
      *(undefined8 *)&__s[-1].field_0x18 = 0x116596;
      build(this,n);
      if (uVar8 == 0) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x11679a;
        __assert_fail("elementCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3d4,"virtual bool rengine::OpenGLRenderer::render()");
      }
      if (this->m_elementIndex != uVar8) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x1167b9;
        __assert_fail("m_elementIndex == elementCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3d5,"virtual bool rengine::OpenGLRenderer::render()");
      }
      *(undefined8 *)&__s[-1].field_0x18 = 0x1165b8;
      setDefaultOpenGLState(this);
      pvVar5 = this->m_vertices;
      *(undefined8 *)&__s[-1].field_0x18 = 0x1165d1;
      glBufferData(0x8892,uVar17 << 3,pvVar5,0x88e4);
      p_Var6 = ((this->super_Renderer).m_surface)->m_impl->_vptr_SurfaceBackendImpl[6];
      *(undefined8 *)&__s[-1].field_0x18 = 0x1165df;
      (*p_Var6)();
      vVar7.y = extraout_XMM0_Db;
      vVar7.x = extraout_XMM0_Da;
      this->m_surfaceSize = vVar7;
      local_104.m[0] = 1.0;
      local_104.m[1] = 0.0;
      local_104.m[2] = 0.0;
      local_104.m[3] = -1.0;
      local_104.m[4] = 0.0;
      local_104.m[5] = 1.0;
      local_104.m[6] = 0.0;
      local_104.m[7] = 1.0;
      local_104.m[8] = 0.0;
      local_104.m[9] = 0.0;
      local_104.m[10] = 1.0;
      local_104.m[0xb] = 0.0;
      local_104.m[0xc] = 0.0;
      local_104.m[0xd] = 0.0;
      local_104.m[0xe] = 0.0;
      local_104.m[0xf] = 1.0;
      local_104.type = 1;
      local_c0[0] = 2.0 / extraout_XMM0_Da;
      local_c0[1] = 0.0;
      local_c0[2] = 0.0;
      local_c0[3] = 0.0;
      local_c0[4] = 0.0;
      local_c0[5] = -2.0 / extraout_XMM0_Db;
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0x3f800000;
      local_94 = 0;
      uStack_8c = 0;
      local_84 = 0x23f800000;
      __s[-3].vboOffset = 0x44;
      __s[-3].z = 0.0;
      lVar10._0_4_ = __s[-3].vboOffset;
      lVar10._4_4_ = __s[-3].z;
      pfVar11 = local_c0;
      puVar13 = &__s[-3].texture;
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(undefined1 *)puVar13 = *(undefined1 *)pfVar11;
        pfVar11 = (float *)((long)pfVar11 + (ulong)bVar18 * -2 + 1);
        puVar13 = (uint *)((long)puVar13 + (ulong)bVar18 * -2 + 1);
      }
      __s[-3].vboOffset = 0x116688;
      __s[-3].z = 0.0;
      mat4::operator*(&local_78,&local_104,*(mat4 *)&__s[-3].texture);
      *(undefined8 *)&__s[-1].field_0x18 = 0x11;
      pmVar12 = &local_78;
      pmVar14 = &this->m_proj;
      for (lVar10 = *(long *)&__s[-1].field_0x18; lVar10 != 0; lVar10 = lVar10 + -1) {
        pmVar14->m[0] = pmVar12->m[0];
        pmVar12 = (mat4 *)((long)pmVar12 + (ulong)bVar18 * -8 + 4);
        pmVar14 = (mat4 *)((long)pmVar14 + (ulong)bVar18 * -8 + 4);
      }
      if ((this->field_0x1f8 & 2) != 0) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x1167d8;
        __assert_fail("!m_layered",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3ea,"virtual bool rengine::OpenGLRenderer::render()");
      }
      if ((this->field_0x1f8 & 1) != 0) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x1167f7;
        __assert_fail("!m_render3d",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3eb,"virtual bool rengine::OpenGLRenderer::render()");
      }
      first = this->m_elements;
      *(undefined8 *)&__s[-1].field_0x18 = 0x1166c6;
      render(this,first,first + uVar16);
      *(undefined8 *)&__s[-1].field_0x18 = 0x1166d0;
      activateShader(this,(Program *)0x0);
      if (this->m_fbo != 0) {
        *(undefined1 **)&__s[-1].field_0x18 = &LAB_00116816;
        __assert_fail("m_fbo == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3f0,"virtual bool rengine::OpenGLRenderer::render()");
      }
      this->m_vertices = (vec2 *)0x0;
      this->m_elements = (Element *)0x0;
    }
  }
  return pNVar4 != (Node *)0x0;
}

Assistant:

inline bool OpenGLRenderer::render()
{
    if (sceneRoot() == 0) {
        logw << " - no 'sceneRoot', surely this is not what you intended?" << std::endl;
        return false;
    }

    vec4 c = fillColor();
    glClearColor(c.x, c.y, c.z, c.w);
    glClear(GL_COLOR_BUFFER_BIT);

    logd << std::endl;

    m_numLayeredNodes = 0;
    m_numTextureNodes = 0;
    m_numRectangleNodes = 0;
    m_numTransformNodes = 0;
    m_numTransformNodesWith3d = 0;
    m_numRenderNodes = 0;
    m_additionalQuads = 0;
    m_vertexIndex = 0;
    m_elementIndex = 0;
    prepass(sceneRoot());

    unsigned vertexCount = (m_numTextureNodes
                            + m_numLayeredNodes
                            + m_numRectangleNodes
                            + m_additionalQuads) * 4;
    if (vertexCount == 0)
        return true;

    m_vertices = (vec2 *) alloca(vertexCount * sizeof(vec2));
    unsigned elementCount = (m_numLayeredNodes + m_numTextureNodes + m_numRectangleNodes + m_numTransformNodesWith3d + m_numRenderNodes);
    m_elements = (Element *) alloca(elementCount * sizeof(Element));
    memset(m_elements, 0, elementCount * sizeof(Element));
    // std::cout << "render: " << m_numTextureNodes << " textures, "
    //                    << m_numRectangleNodes << " rects, "
    //                    << m_numTransformNodes << " xforms, "
    //                    << m_numTransformNodesWith3d << " xforms3D, "
    //                    << m_numLayeredNodes << " layered nodes (opacity, colorfilter, blur or shadow), "
    //                    << vertexCount * sizeof(vec2) << " bytes (" << vertexCount << " vertices), "
    //                    << elementCount * sizeof(Element) << " bytes (" << elementCount << " elements)"
    //                    << std::endl;
    build(sceneRoot());
    assert(elementCount > 0);
    assert(m_elementIndex == elementCount);
    // for (unsigned i=0; i<m_elementIndex; ++i) {
    //     const Element &e = m_elements[i];
    //     std::cout << " " << std::setw(5) << i << ": " << "element=" << &e << " node=" << e.node << " " << e.node->type() << " "
    //          << (e.projection ? "projection " : "")
    //          << "vboOffset=" << std::setw(5) << e.vboOffset << " "
    //          << "groupSize=" << std::setw(3) << e.groupSize << " "
    //          << "z=" << e.z << " " << std::endl;
    // }
    // for (unsigned i=0; i<m_vertexIndex; ++i)
    //     std::cout << "vertex[" << std::setw(5) << i << "]=" << m_vertices[i] << std::endl;

    setDefaultOpenGLState();

    // setDefaultOpenGLState will leave m_vertexBuffer bound, so we just upload into it..
    glBufferData(GL_ARRAY_BUFFER, vertexCount * sizeof(vec2), m_vertices, GL_STATIC_DRAW);

    m_surfaceSize = targetSurface()->size();
    m_proj = mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / m_surfaceSize.x, -2.0f / m_surfaceSize.y);

    assert(!m_layered);
    assert(!m_render3d);
    render(m_elements, m_elements + elementCount);

    activateShader(0);

    assert(m_fbo == 0);
    m_vertices = 0;
    m_elements = 0;

    logd << std::endl;

    return true;
}